

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O0

void __thiscall
Assimp::STEP::DB::DB(DB *this,shared_ptr<Assimp::StreamReader<false,_false>_> *reader)

{
  element_type *stream;
  shared_ptr<Assimp::StreamReader<false,_false>_> *reader_local;
  DB *this_local;
  
  HeaderInfo::HeaderInfo(&this->header);
  std::
  map<unsigned_long,_const_Assimp::STEP::LazyObject_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_Assimp::STEP::LazyObject_*>_>_>
  ::map(&this->objects);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>_>
  ::map(&this->objects_bytype);
  std::
  multimap<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::multimap(&this->refs);
  std::set<const_char_*,_std::less<const_char_*>,_std::allocator<const_char_*>_>::set
            (&this->inv_whitelist);
  std::shared_ptr<Assimp::StreamReader<false,_false>_>::shared_ptr(&this->reader,reader);
  stream = std::
           __shared_ptr_access<Assimp::StreamReader<false,_false>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<Assimp::StreamReader<false,_false>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)reader);
  LineSplitter::LineSplitter(&this->splitter,stream,true,true);
  this->evaluated_count = 0;
  this->schema = (ConversionSchema *)0x0;
  return;
}

Assistant:

DB(std::shared_ptr<StreamReaderLE> reader)
            : reader(reader)
            , splitter(*reader,true,true)
            , evaluated_count()
            , schema( nullptr )
        {}